

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::testIndexedQueriesForInvalidBindingPoint
          (ErrorsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  bool bVar7;
  bool bVar8;
  GLuint xfb;
  long local_1d8;
  Enum<int,_2UL> local_1d0;
  GLint buffer;
  GLint max_transform_feedback_buffers;
  GLint64 buffer64;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  max_transform_feedback_buffers = 4;
  (**(code **)(lVar6 + 0x868))(0x8e70,&max_transform_feedback_buffers);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x5b6);
  xfb = 0;
  (**(code **)(lVar6 + 0x408))(1,&xfb);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x5bc);
  buffer = 0x4cb2f;
  buffer64 = 0x4cb2f;
  (*this->m_gl_getTransformFeedbacki_v)(xfb,0x8c8f,max_transform_feedback_buffers,&buffer);
  local_1d8 = lVar6;
  iVar2 = (**(code **)(lVar6 + 0x800))();
  if (iVar2 != 0x501) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki_v called with invalid index had been expected to generate GL_INVALID_VALUE. However, "
                   );
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," was captured.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  bVar7 = buffer != 0x4cb2f;
  if (bVar7) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki_v called with invalid index had been expected not to change the given buffer."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  while( true ) {
    iVar4 = (**(code **)(local_1d8 + 0x800))();
    if (iVar4 == 0) break;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning! glGetTransformFeedbacki_v called with invalid index has unexpectedly generated more than one error, The next error was  "
                   );
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (*this->m_gl_getTransformFeedbacki64_v)(xfb,0x8c84,max_transform_feedback_buffers,&buffer64);
  iVar4 = (**(code **)(local_1d8 + 0x800))();
  if (iVar4 != 0x501) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki64_v called with invalid index had been expected to generate GL_INVALID_VALUE. However, "
                   );
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," was captured.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  bVar8 = buffer64 != 0x4cb2f;
  if (bVar8) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki64_v called with invalid index had been expected not to change the given buffer."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  while( true ) {
    iVar5 = (**(code **)(local_1d8 + 0x800))();
    lVar6 = local_1d8;
    if (iVar5 == 0) break;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning! glGetTransformFeedbacki64_v called with invalid index has unexpectedly generated more than one error, The next error was  "
                   );
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar5;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (**(code **)(local_1d8 + 0x488))(1,&xfb);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glDeleteTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x608);
  return !bVar8 && (iVar4 == 0x501 && (!bVar7 && iVar2 == 0x501));
}

Assistant:

bool ErrorsTest::testIndexedQueriesForInvalidBindingPoint()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generating invalid index. */
	glw::GLint max_transform_feedback_buffers =
		4; /* Default limit is 4 - OpenGL 4.5 Core Specification, Table 23.72: Implementation Dependent Transform Feedback Limits. */

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

	/* Creating XFB object. */
	glw::GLuint xfb = 0;

	gl.createTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Dummy storage. */
	glw::GLint   buffer   = 314159;
	glw::GLint64 buffer64 = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Default result. */
	bool is_ok = true;

	/* Test of GetTransformFeedbacki_v. */
	m_gl_getTransformFeedbacki_v(xfb, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, max_transform_feedback_buffers, &buffer);

	if (GL_INVALID_VALUE != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid index had been expected "
											   "to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "glGetTransformFeedbacki_v called with invalid index had been expected not to change the given buffer."
			<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid index has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki64_v. */
	m_gl_getTransformFeedbacki64_v(xfb, GL_TRANSFORM_FEEDBACK_BUFFER_START, max_transform_feedback_buffers, &buffer64);

	if (GL_INVALID_VALUE != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid index had been "
											   "expected to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer64)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "glGetTransformFeedbacki64_v called with invalid index had been expected not to change the given buffer."
			<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid index has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Clean-up. */
	gl.deleteTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTransformFeedbacks have failed");

	return is_ok;
}